

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O0

void sznet::net::sockets::sz_toip(char *buf,size_t size,sockaddr *addr)

{
  sockaddr_in *psVar1;
  sockaddr_in6 *psVar2;
  sockaddr_in6 *addr6;
  sockaddr_in *addr4;
  sockaddr *addr_local;
  size_t size_local;
  char *buf_local;
  
  if (addr->sa_family == 2) {
    if (size < 0x10) {
      __assert_fail("size >= INET_ADDRSTRLEN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SocketsOps.cpp"
                    ,0xdb,
                    "void sznet::net::sockets::sz_toip(char *, size_t, const struct sockaddr *)");
    }
    psVar1 = sz_sockaddrin_cast(addr);
    inet_ntop(2,&psVar1->sin_addr,buf,(socklen_t)size);
  }
  else if (addr->sa_family == 10) {
    if (size < 0x2e) {
      __assert_fail("size >= INET6_ADDRSTRLEN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SocketsOps.cpp"
                    ,0xe1,
                    "void sznet::net::sockets::sz_toip(char *, size_t, const struct sockaddr *)");
    }
    psVar2 = sz_sockaddrin6_cast(addr);
    inet_ntop(10,&psVar2->sin6_addr,buf,(socklen_t)size);
  }
  return;
}

Assistant:

void sz_toip(char* buf, size_t size, const struct sockaddr* addr)
{
	if (addr->sa_family == AF_INET)
	{
		assert(size >= INET_ADDRSTRLEN);
		const struct sockaddr_in* addr4 = sz_sockaddrin_cast(addr);
		::inet_ntop(AF_INET, (void*)(&addr4->sin_addr), buf, size);
	}
	else if (addr->sa_family == AF_INET6)
	{
		assert(size >= INET6_ADDRSTRLEN);
		const struct sockaddr_in6* addr6 = sz_sockaddrin6_cast(addr);
		::inet_ntop(AF_INET6, (void*)(&addr6->sin6_addr), buf, size);
	}
}